

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O3

void send_ping(cio_timer *timer,void *handler_context,cio_error err)

{
  cio_error cVar1;
  cio_write_buffer local_30;
  
  if (err != CIO_OPERATION_ABORTED) {
    if (err == CIO_SUCCESS) {
      fwrite("Sending ping!\n",0xe,1,_stdout);
      local_30.next = (cio_write_buffer *)((long)handler_context + 0x400);
      *(char **)((long)handler_context + 0x410) = "ping";
      *(undefined8 *)((long)handler_context + 0x418) = 4;
      *(cio_write_buffer **)((long)handler_context + 0x400) = &local_30;
      *(cio_write_buffer **)((long)handler_context + 0x408) = &local_30;
      local_30.data.head.q_len = 1;
      local_30.data.element.length = 4;
      local_30.prev = local_30.next;
      cVar1 = cio_websocket_write_ping
                        ((cio_websocket *)handler_context,&local_30,ping_written,timer);
      if (cVar1 != CIO_SUCCESS) {
        send_ping_cold_1();
      }
    }
    else {
      send_ping_cold_2();
    }
  }
  return;
}

Assistant:

static void send_ping(struct cio_timer *timer, void *handler_context, enum cio_error err)
{
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (err == CIO_SUCCESS) {
		(void)fprintf(stdout, "Sending ping!\n");

		struct cio_websocket_location_handler *handler = cio_container_of(websocket, struct cio_websocket_location_handler, websocket);
		struct ws_echo_handler *echo_handler = cio_container_of(handler, struct ws_echo_handler, ws_handler);

		struct cio_write_buffer wbh;
		cio_write_buffer_head_init(&wbh);
		static const char *ping_message = "ping";
		cio_write_buffer_const_element_init(&echo_handler->wb_ping_message, ping_message, strlen(ping_message));
		cio_write_buffer_queue_head(&wbh, &echo_handler->wb_ping_message);
		err = cio_websocket_write_ping(websocket, &wbh, ping_written, timer);
		if (err != CIO_SUCCESS) {
			(void)fprintf(stderr, "Could not start writing websocket ping!\n");
		}
	} else if (err != CIO_OPERATION_ABORTED) {
		(void)fprintf(stderr, "ping timer failed!\n");
		err = cio_websocket_close(websocket, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, NULL, NULL, NULL);
		if (err != CIO_SUCCESS) {
			(void)fprintf(stderr, "Could not start writing websocket close!\n");
		}
	}
}